

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Group.c
# Opt level: O2

void Llb_ManPrintSpan(Llb_Man_t *p)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  void *pvVar4;
  uint uVar5;
  int i;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  
  i = 0;
  uVar8 = 0;
  uVar5 = 0;
  while( true ) {
    if (p->vGroups->nSize <= i) break;
    pvVar3 = Vec_PtrEntry(p->vGroups,i);
    for (iVar7 = 0; iVar7 < (*(Vec_Ptr_t **)((long)pvVar3 + 8))->nSize; iVar7 = iVar7 + 1) {
      pvVar4 = Vec_PtrEntry(*(Vec_Ptr_t **)((long)pvVar3 + 8),iVar7);
      iVar2 = Vec_IntEntry(p->vVarBegs,*(int *)((long)pvVar4 + 0x24));
      uVar5 = uVar5 + (iVar2 == i);
    }
    for (iVar7 = 0; iVar7 < (*(Vec_Ptr_t **)((long)pvVar3 + 0x10))->nSize; iVar7 = iVar7 + 1) {
      pvVar4 = Vec_PtrEntry(*(Vec_Ptr_t **)((long)pvVar3 + 0x10),iVar7);
      iVar2 = Vec_IntEntry(p->vVarBegs,*(int *)((long)pvVar4 + 0x24));
      uVar5 = uVar5 + (iVar2 == i);
    }
    printf("%d ",(ulong)uVar5);
    uVar6 = uVar5;
    for (iVar7 = 0; iVar7 < (*(Vec_Ptr_t **)((long)pvVar3 + 8))->nSize; iVar7 = iVar7 + 1) {
      pvVar4 = Vec_PtrEntry(*(Vec_Ptr_t **)((long)pvVar3 + 8),iVar7);
      iVar2 = Vec_IntEntry(p->vVarEnds,*(int *)((long)pvVar4 + 0x24));
      uVar6 = uVar6 - (iVar2 == i);
    }
    for (iVar7 = 0; iVar7 < (*(Vec_Ptr_t **)((long)pvVar3 + 0x10))->nSize; iVar7 = iVar7 + 1) {
      pvVar4 = Vec_PtrEntry(*(Vec_Ptr_t **)((long)pvVar3 + 0x10),iVar7);
      iVar2 = Vec_IntEntry(p->vVarEnds,*(int *)((long)pvVar4 + 0x24));
      uVar6 = uVar6 - (iVar2 == i);
    }
    uVar1 = (uint)uVar8;
    if ((int)(uint)uVar8 <= (int)uVar5) {
      uVar1 = uVar5;
    }
    uVar8 = (ulong)uVar1;
    i = i + 1;
    uVar5 = uVar6;
  }
  putchar(10);
  printf("Max = %d\n",uVar8);
  return;
}

Assistant:

void Llb_ManPrintSpan( Llb_Man_t * p )
{
    Llb_Grp_t * pGroup;
    Aig_Obj_t * pVar;
    int i, k, Span = 0, SpanMax = 0;
    Vec_PtrForEachEntry( Llb_Grp_t *, p->vGroups, pGroup, i )
    {
        Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vIns, pVar, k )
            if ( Vec_IntEntry(p->vVarBegs, pVar->Id) == i )
                Span++;
        Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vOuts, pVar, k )
            if ( Vec_IntEntry(p->vVarBegs, pVar->Id) == i )
                Span++;

        SpanMax = Abc_MaxInt( SpanMax, Span );
printf( "%d ", Span );

        Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vIns, pVar, k )
            if ( Vec_IntEntry(p->vVarEnds, pVar->Id) == i )
                Span--;
        Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vOuts, pVar, k )
            if ( Vec_IntEntry(p->vVarEnds, pVar->Id) == i )
                Span--;
    }
printf( "\n" );
printf( "Max = %d\n", SpanMax );
}